

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O2

void __thiscall
cmMessenger::DisplayMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  cmListFileContext *pcVar4;
  char *pcVar5;
  string_view str;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  cmListFileContext lfc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  if (t < (DEPRECATION_WARNING|AUTHOR_ERROR)) {
    pcVar5 = &DAT_005a8598 + *(int *)(&DAT_005a8598 + (ulong)t * 4);
  }
  else {
    pcVar5 = "CMake Warning";
  }
  std::operator<<((ostream *)&msg,pcVar5);
  PrintBacktraceTitle(this,(ostream *)&msg,backtrace);
  std::operator<<((ostream *)&msg,":\n");
  cmDocumentationFormatter::cmDocumentationFormatter((cmDocumentationFormatter *)&lfc);
  cmDocumentationFormatter::SetIndent((cmDocumentationFormatter *)&lfc,"  ");
  cmDocumentationFormatter::PrintFormatted
            ((cmDocumentationFormatter *)&lfc,(ostream *)&msg,(text->_M_dataplus)._M_p);
  cmDocumentationFormatter::~cmDocumentationFormatter((cmDocumentationFormatter *)&lfc);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_270,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)backtrace);
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_270);
  if (!bVar1) {
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&lfc);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&local_270,
                (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 *)&lfc);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lfc.Name._M_string_length);
    bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_270);
    if (!bVar1) {
      bVar1 = true;
      while( true ) {
        bVar2 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                          ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_270);
        if (bVar2) break;
        pcVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                           ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_270);
        cmListFileContext::cmListFileContext(&lfc,pcVar4);
        if ((lfc.Name._M_string_length != 0) || (lfc.Line == -1)) {
          if (bVar1) {
            std::operator<<((ostream *)&msg,"Call Stack (most recent call first):\n");
          }
          if ((this->TopSource).
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged == true) {
            cmSystemTools::RelativeIfUnder(&local_260,(string *)this,&lfc.FilePath);
            std::__cxx11::string::operator=((string *)&lfc.FilePath,(string *)&local_260);
            std::__cxx11::string::~string((string *)&local_260);
          }
          poVar3 = std::operator<<((ostream *)&msg,"  ");
          poVar3 = operator<<(poVar3,&lfc);
          std::operator<<(poVar3,"\n");
          bVar1 = false;
        }
        cmListFileContext::~cmListFileContext(&lfc);
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&lfc);
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&local_270,
                    (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     *)&lfc);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lfc.Name._M_string_length);
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270._M_refcount);
  if (t == AUTHOR_WARNING) {
    pcVar5 = "This warning is for project developers.  Use -Wno-dev to suppress it.";
LAB_00371fdd:
    std::operator<<((ostream *)&msg,pcVar5);
  }
  else if (t == AUTHOR_ERROR) {
    pcVar5 = "This error is for project developers. Use -Wno-error=dev to suppress it.";
    goto LAB_00371fdd;
  }
  std::operator<<((ostream *)&msg,"\n");
  if (t == INTERNAL_ERROR) {
    cmsys::SystemInformation::GetProgramStack_abi_cxx11_(&lfc.Name,(SystemInformation *)0x0,0,3);
    if (lfc.Name._M_string_length != 0) {
      str._M_str = lfc.Name._M_dataplus._M_p;
      str._M_len = lfc.Name._M_string_length;
      bVar1 = cmHasLiteralPrefix<9ul>(str,(char (*) [9])"WARNING:");
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&lfc);
        std::operator+(&local_260,"Note:",&local_1c8);
        std::__cxx11::string::operator=((string *)&lfc,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      poVar3 = std::operator<<((ostream *)&msg,(string *)&lfc);
      std::operator<<(poVar3,"\n");
    }
    std::__cxx11::string::~string((string *)&lfc);
    local_260._M_string_length._0_4_ = 2;
  }
  else {
    local_260._M_string_length._0_4_ = 0;
    if (t < LOG) {
      local_260._M_string_length._0_4_ = *(undefined4 *)(&DAT_005a85bc + (ulong)t * 4);
    }
    if ((DEPRECATION_ERROR < t) || ((0x8eU >> (t & 0x1f) & 1) == 0)) {
      local_260._M_dataplus._M_p = "Warning";
      std::__cxx11::stringbuf::str();
      cmSystemTools::Message(&lfc.Name,(cmMessageMetadata *)&local_260);
      goto LAB_00372138;
    }
  }
  cmSystemTools::s_ErrorOccurred = true;
  local_260._M_dataplus._M_p = "Error";
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message(&lfc.Name,(cmMessageMetadata *)&local_260);
LAB_00372138:
  std::__cxx11::string::~string((string *)&lfc);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  return;
}

Assistant:

void cmMessenger::DisplayMessage(MessageType t, const std::string& text,
                                 const cmListFileBacktrace& backtrace) const
{
  std::ostringstream msg;
  if (!printMessagePreamble(t, msg)) {
    return;
  }

  // Add the immediate context.
  this->PrintBacktraceTitle(msg, backtrace);

  printMessageText(msg, text);

  // Add the rest of the context.
  PrintCallStack(msg, backtrace, this->TopSource);

  displayMessage(t, msg);
}